

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O1

bool __thiscall
draco::RAnsSymbolEncoder<13>::Create
          (RAnsSymbolEncoder<13> *this,uint64_t *frequencies,int num_symbols,EncoderBuffer *buffer)

{
  pointer prVar1;
  uint64_t uVar2;
  long lVar3;
  pointer __first;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int i;
  int iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  int *piVar20;
  double dVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  pair<int_*,_long> pVar25;
  vector<int,_std::allocator<int>_> sorted_probabilities;
  allocator_type local_99;
  int *local_98;
  double dStack_90;
  ulong local_88;
  vector<int,_std::allocator<int>_> local_80;
  undefined1 local_68 [16];
  EncoderBuffer *local_58;
  ulong local_50;
  uint64_t *local_48;
  RAnsSymbolEncoder<13> *local_40;
  int *local_38;
  
  iVar12 = 0;
  if (num_symbols < 1) {
    local_98 = (int *)0x0;
    dStack_90 = 0.0;
    uVar11 = 0;
  }
  else {
    uVar8 = 0;
    lVar10 = 0;
    uVar11 = 0;
    do {
      lVar10 = lVar10 + frequencies[uVar8];
      if (frequencies[uVar8] != 0) {
        uVar11 = uVar8 & 0xffffffff;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)num_symbols != uVar8);
    auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar17._0_8_ = lVar10;
    auVar17._12_4_ = 0x45300000;
    dStack_90 = auVar17._8_8_ - 1.9342813113834067e+25;
    local_98 = (int *)(dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  }
  uVar5 = (uint)uVar11;
  uVar16 = uVar5 + 1;
  uVar8 = (ulong)uVar16;
  this->num_symbols_ = uVar16;
  local_58 = buffer;
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            (&this->probability_table_,(long)(int)uVar16);
  if (-1 < (int)uVar5) {
    prVar1 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    dVar19 = (double)DAT_001ad1b0;
    dVar23 = DAT_001ad1b0._8_8_;
    iVar12 = 0;
    do {
      uVar2 = frequencies[uVar9];
      auVar24._8_4_ = (int)(uVar2 >> 0x20);
      auVar24._0_8_ = uVar2;
      auVar24._12_4_ = 0x45300000;
      uVar14 = (uint32_t)
               (long)((((auVar24._8_8_ - dVar23) +
                       ((double)CONCAT44(0x43300000,(int)uVar2) - dVar19)) / (double)local_98) *
                      524288.0 + 0.5);
      uVar13 = uVar14;
      if (uVar2 != 0) {
        uVar13 = 1;
      }
      if (uVar14 != 0) {
        uVar13 = uVar14;
      }
      prVar1[uVar9].prob = uVar13;
      iVar12 = iVar12 + uVar13;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (iVar12 == 0x80000) {
LAB_001993ff:
    uVar5 = 0;
    if ((int)uVar11 < 0) goto LAB_00199625;
    prVar1 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      prVar1[uVar11].cum_prob = uVar5;
      uVar5 = uVar5 + prVar1[uVar11].prob;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    if (uVar5 == 0x80000) {
      piVar20 = (int *)0x0;
      dVar19 = 0.0;
      uVar11 = 0;
      do {
        uVar5 = (this->probability_table_).
                super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11].prob;
        if (uVar5 != 0) {
          auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)frequencies[uVar11]);
          auVar22._8_4_ = (int)(frequencies[uVar11] >> 0x20);
          auVar22._12_4_ = 0x45300000;
          dVar23 = auVar22._8_8_ - 1.9342813113834067e+25;
          local_68._0_8_ = dVar23 + (auVar22._0_8_ - 4503599627370496.0);
          local_68._8_8_ = dVar23;
          local_98 = piVar20;
          dStack_90 = dVar19;
          dVar19 = log2((double)uVar5 * 1.9073486328125e-06);
          piVar20 = (int *)((double)local_98 + dVar19 * (double)local_68._0_8_);
          dVar19 = dStack_90;
          local_98 = piVar20;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      dVar19 = ceil(-(double)piVar20);
      this->num_expected_bits_ =
           (long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f | (long)dVar19;
      bVar4 = EncodeTable(this,local_58);
      uVar5 = (uint)bVar4;
      goto LAB_00199625;
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector(&local_80,(long)(int)uVar16,&local_99);
    __first = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    auVar17 = _DAT_001a7aa0;
    if (-1 < (int)uVar5) {
      auVar18._8_4_ = uVar5;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = 0;
      uVar9 = 0;
      auVar18 = auVar18 ^ _DAT_001a7aa0;
      auVar21 = _DAT_001a7a90;
      do {
        auVar24 = auVar21 ^ auVar17;
        if ((bool)(~(auVar24._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar24._0_4_ ||
                    auVar18._4_4_ < auVar24._4_4_) & 1)) {
          local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] = (int)uVar9;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 + 1] = (int)uVar9 + 1;
        }
        uVar9 = uVar9 + 2;
        lVar10 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 2;
        auVar21._8_8_ = lVar10 + 2;
      } while ((uVar5 & 0x7ffffffe) + 2 != uVar9);
    }
    local_88 = uVar11;
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_68._0_8_ =
           local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      lVar10 = (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      pVar25 = std::get_temporary_buffer<int>((lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
      lVar10 = pVar25.second;
      local_98 = pVar25.first;
      if (local_98 == (int *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_68._0_8_
                   ,(_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>)this);
        lVar10 = 0;
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_68._0_8_
                   ,local_98,lVar10,
                   (_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>)this);
      }
      operator_delete(local_98,lVar10 << 2);
    }
    if (iVar12 < 0x80000) {
      prVar1 = (this->probability_table_).
               super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
               super__Vector_impl_data._M_start;
      prVar1[local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-1]].prob =
           (prVar1[local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]].prob - iVar12) + 0x80000;
LAB_001993e3:
      uVar11 = local_88;
      if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        uVar11 = local_88;
      }
      goto LAB_001993ff;
    }
    iVar15 = iVar12 + -0x80000;
    prVar1 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_98 = (int *)((local_88 & 0xffffffff) + 1);
    piVar20 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + (local_88 & 0xffffffff);
    local_50 = uVar8;
    local_48 = frequencies;
    local_40 = this;
    local_38 = piVar20;
    do {
      if (iVar15 < 1) goto LAB_001993e3;
      if ((int)local_88 < 1) {
        bVar4 = true;
      }
      else {
        local_68._0_8_ = 524288.0 / (double)iVar12;
        lVar10 = 0;
        do {
          iVar7 = piVar20[lVar10];
          uVar5 = prVar1[iVar7].prob;
          if (uVar5 < 2) {
            iVar7 = 0xd;
            if (lVar10 == 0) {
              iVar7 = 1;
            }
          }
          else {
            dVar19 = floor((double)uVar5 * (double)local_68._0_8_);
            iVar6 = 1;
            if (uVar5 - (int)dVar19 != 0) {
              iVar6 = uVar5 - (int)dVar19;
            }
            if ((int)uVar5 <= iVar6) {
              iVar6 = uVar5 - 1;
            }
            if (iVar15 <= iVar6) {
              iVar6 = iVar15;
            }
            prVar1[iVar7].prob = uVar5 - iVar6;
            iVar12 = iVar12 - iVar6;
            iVar7 = 0xd;
            if (iVar12 != 0x80000) {
              iVar7 = 0;
            }
            iVar15 = iVar15 - iVar6;
            piVar20 = local_38;
          }
          if (iVar7 != 0) goto LAB_001995eb;
          lVar3 = lVar10 + -1;
          lVar10 = lVar10 + -1;
        } while (1 < (long)local_98 + lVar3);
        iVar7 = 0xd;
LAB_001995eb:
        bVar4 = iVar7 == 0xd;
        uVar8 = local_50;
        this = local_40;
        frequencies = local_48;
      }
    } while (bVar4);
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  uVar5 = 0;
LAB_00199625:
  return SUB41(uVar5,0);
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::Create(
    const uint64_t *frequencies, int num_symbols, EncoderBuffer *buffer) {
  // Compute the total of the input frequencies.
  uint64_t total_freq = 0;
  int max_valid_symbol = 0;
  for (int i = 0; i < num_symbols; ++i) {
    total_freq += frequencies[i];
    if (frequencies[i] > 0) {
      max_valid_symbol = i;
    }
  }
  num_symbols = max_valid_symbol + 1;
  num_symbols_ = num_symbols;
  probability_table_.resize(num_symbols);
  const double total_freq_d = static_cast<double>(total_freq);
  const double rans_precision_d = static_cast<double>(rans_precision_);
  // Compute probabilities by rescaling the normalized frequencies into interval
  // [1, rans_precision - 1]. The total probability needs to be equal to
  // rans_precision.
  int total_rans_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    const uint64_t freq = frequencies[i];

    // Normalized probability.
    const double prob = static_cast<double>(freq) / total_freq_d;

    // RAns probability in range of [1, rans_precision - 1].
    uint32_t rans_prob = static_cast<uint32_t>(prob * rans_precision_d + 0.5f);
    if (rans_prob == 0 && freq > 0) {
      rans_prob = 1;
    }
    probability_table_[i].prob = rans_prob;
    total_rans_prob += rans_prob;
  }
  // Because of rounding errors, the total precision may not be exactly accurate
  // and we may need to adjust the entries a little bit.
  if (total_rans_prob != rans_precision_) {
    std::vector<int> sorted_probabilities(num_symbols);
    for (int i = 0; i < num_symbols; ++i) {
      sorted_probabilities[i] = i;
    }
    std::stable_sort(sorted_probabilities.begin(), sorted_probabilities.end(),
                     ProbabilityLess(&probability_table_));
    if (total_rans_prob < rans_precision_) {
      // This happens rather infrequently, just add the extra needed precision
      // to the most frequent symbol.
      probability_table_[sorted_probabilities.back()].prob +=
          rans_precision_ - total_rans_prob;
    } else {
      // We have over-allocated the precision, which is quite common.
      // Rescale the probabilities of all symbols.
      int32_t error = total_rans_prob - rans_precision_;
      while (error > 0) {
        const double act_total_prob_d = static_cast<double>(total_rans_prob);
        const double act_rel_error_d = rans_precision_d / act_total_prob_d;
        for (int j = num_symbols - 1; j > 0; --j) {
          int symbol_id = sorted_probabilities[j];
          if (probability_table_[symbol_id].prob <= 1) {
            if (j == num_symbols - 1) {
              return false;  // Most frequent symbol would be empty.
            }
            break;
          }
          const int32_t new_prob = static_cast<int32_t>(
              floor(act_rel_error_d *
                    static_cast<double>(probability_table_[symbol_id].prob)));
          int32_t fix = probability_table_[symbol_id].prob - new_prob;
          if (fix == 0u) {
            fix = 1;
          }
          if (fix >= static_cast<int32_t>(probability_table_[symbol_id].prob)) {
            fix = probability_table_[symbol_id].prob - 1;
          }
          if (fix > error) {
            fix = error;
          }
          probability_table_[symbol_id].prob -= fix;
          total_rans_prob -= fix;
          error -= fix;
          if (total_rans_prob == rans_precision_) {
            break;
          }
        }
      }
    }
  }

  // Compute the cumulative probability (cdf).
  uint32_t total_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    probability_table_[i].cum_prob = total_prob;
    total_prob += probability_table_[i].prob;
  }
  if (total_prob != rans_precision_) {
    return false;
  }

  // Estimate the number of bits needed to encode the input.
  // From Shannon entropy the total number of bits N is:
  //   N = -sum{i : all_symbols}(F(i) * log2(P(i)))
  // where P(i) is the normalized probability of symbol i and F(i) is the
  // symbol's frequency in the input data.
  double num_bits = 0;
  for (int i = 0; i < num_symbols; ++i) {
    if (probability_table_[i].prob == 0) {
      continue;
    }
    const double norm_prob =
        static_cast<double>(probability_table_[i].prob) / rans_precision_d;
    num_bits += static_cast<double>(frequencies[i]) * log2(norm_prob);
  }
  num_expected_bits_ = static_cast<uint64_t>(ceil(-num_bits));
  if (!EncodeTable(buffer)) {
    return false;
  }
  return true;
}